

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lputil.c
# Opt level: O0

_Bool ValidateMagicF(FILE *file,uint8_t *expected_magic,size_t magic_len)

{
  void *__ptr;
  int local_34;
  int i;
  uint8_t *our_magic;
  _Bool rv;
  size_t magic_len_local;
  uint8_t *expected_magic_local;
  FILE *file_local;
  
  our_magic._7_1_ = true;
  __ptr = malloc(magic_len);
  if (__ptr == (void *)0x0) {
    LPWarn("","(%s) Couldn\'t malloc our magic","ValidateMagicF");
    fclose((FILE *)file);
    our_magic._7_1_ = false;
  }
  else {
    fread(__ptr,1,magic_len,(FILE *)file);
    for (local_34 = 0; (ulong)(long)local_34 < magic_len; local_34 = local_34 + 1) {
      if (*(uint8_t *)((long)__ptr + (long)local_34) != expected_magic[local_34]) {
        LPDebug("","(%s) %d != %d","ValidateMagicF",(ulong)*(byte *)((long)__ptr + (long)local_34),
                (ulong)expected_magic[local_34]);
        fclose((FILE *)file);
        our_magic._7_1_ = false;
        break;
      }
    }
  }
  free(__ptr);
  return our_magic._7_1_;
}

Assistant:

bool
ValidateMagicF(FILE *file, const uint8_t *expected_magic, const size_t magic_len)
{
	bool rv = true;

	uint8_t *our_magic = malloc(magic_len);
	if (!our_magic) {
		LPWarn("", "(%s) Couldn't malloc our magic", __func__);
		fclose(file);
		rv = false;
		goto done;
	}

	fread(our_magic, 1, magic_len, file);

	for (int i = 0; i < magic_len; i++) {
		if (our_magic[i] != expected_magic[i]) {
			LPDebug("", "(%s) %d != %d", __func__, our_magic[i], expected_magic[i]);
			fclose(file);
			rv = false;
			goto done;
		}
	}

done:
	free(our_magic);
	return rv;
}